

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O2

int32_t icu_63::anon_unknown_9::appendResult
                  (UChar *dest,int32_t destIndex,int32_t destCapacity,int32_t result,UChar *s,
                  int32_t cpLength,uint32_t options,Edits *edits)

{
  long lVar1;
  int32_t newLength;
  bool bVar2;
  
  if (result < 0) {
    if (edits != (Edits *)0x0) {
      Edits::addUnchanged(edits,cpLength);
    }
    if ((options >> 0xe & 1) != 0) {
      return destIndex;
    }
    bVar2 = 0xfffeffff < (uint)result;
    result = ~result;
    newLength = cpLength;
    if (bVar2 && destIndex < destCapacity) {
      dest[destIndex] = (UChar)result;
      return destIndex + 1;
    }
  }
  else {
    if ((uint)result < 0x20) {
      newLength = result;
      result = 0xffffffff;
    }
    else {
      if ((uint)result < 0x10000 && destIndex < destCapacity) {
        dest[destIndex] = (UChar)result;
        if (edits == (Edits *)0x0) {
          return destIndex + 1;
        }
        Edits::addReplace(edits,cpLength,1);
        return destIndex + 1;
      }
      newLength = 2 - (uint)((uint)result < 0x10000);
    }
    if (edits != (Edits *)0x0) {
      Edits::addReplace(edits,cpLength,newLength);
    }
  }
  if ((int)(destIndex ^ 0x7fffffffU) < newLength) {
    return -1;
  }
  if (destIndex < destCapacity) {
    if (result < 0) {
      if (destCapacity < newLength + destIndex) {
        return newLength + destIndex;
      }
      lVar1 = 0;
      for (; 0 < newLength; newLength = newLength + -1) {
        dest[destIndex + lVar1] = s[lVar1];
        lVar1 = lVar1 + 1;
      }
      return destIndex + (int)lVar1;
    }
    if ((uint)result < 0x10000) {
      dest[destIndex] = (UChar)result;
      return destIndex + 1;
    }
    if (((uint)result < 0x110000) && (destIndex + 1 < destCapacity)) {
      dest[destIndex] = (short)((uint)result >> 10) + L'ퟀ';
      dest[destIndex + 1] = (UChar)result & 0x3ffU | 0xdc00;
      return destIndex + 2;
    }
  }
  return newLength + destIndex;
}

Assistant:

inline int32_t
appendResult(UChar *dest, int32_t destIndex, int32_t destCapacity,
             int32_t result, const UChar *s,
             int32_t cpLength, uint32_t options, icu::Edits *edits) {
    UChar32 c;
    int32_t length;

    /* decode the result */
    if(result<0) {
        /* (not) original code point */
        if(edits!=NULL) {
            edits->addUnchanged(cpLength);
        }
        if(options & U_OMIT_UNCHANGED_TEXT) {
            return destIndex;
        }
        c=~result;
        if(destIndex<destCapacity && c<=0xffff) {  // BMP slightly-fastpath
            dest[destIndex++]=(UChar)c;
            return destIndex;
        }
        length=cpLength;
    } else {
        if(result<=UCASE_MAX_STRING_LENGTH) {
            c=U_SENTINEL;
            length=result;
        } else if(destIndex<destCapacity && result<=0xffff) {  // BMP slightly-fastpath
            dest[destIndex++]=(UChar)result;
            if(edits!=NULL) {
                edits->addReplace(cpLength, 1);
            }
            return destIndex;
        } else {
            c=result;
            length=U16_LENGTH(c);
        }
        if(edits!=NULL) {
            edits->addReplace(cpLength, length);
        }
    }
    if(length>(INT32_MAX-destIndex)) {
        return -1;  // integer overflow
    }

    if(destIndex<destCapacity) {
        /* append the result */
        if(c>=0) {
            /* code point */
            UBool isError=FALSE;
            U16_APPEND(dest, destIndex, destCapacity, c, isError);
            if(isError) {
                /* overflow, nothing written */
                destIndex+=length;
            }
        } else {
            /* string */
            if((destIndex+length)<=destCapacity) {
                while(length>0) {
                    dest[destIndex++]=*s++;
                    --length;
                }
            } else {
                /* overflow */
                destIndex+=length;
            }
        }
    } else {
        /* preflight */
        destIndex+=length;
    }
    return destIndex;
}